

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
slang::ast::FmtHelpers::formatDisplay_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FmtHelpers *this,Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args)

{
  Symbol **ppSVar1;
  ExpressionKind EVar2;
  SymbolKind SVar3;
  Compilation *this_00;
  ulong uVar4;
  Type *this_01;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  bool bVar5;
  Type *pTVar6;
  undefined8 *puVar7;
  ulong uVar8;
  Type *type;
  char specifier;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  string_view str;
  string result;
  iterator argIt;
  byte local_c2;
  undefined1 local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  Scope *local_98;
  FormatOptions local_90;
  FmtHelpers *local_78;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_70;
  Scope *local_50;
  byte *local_48;
  code *local_40;
  undefined1 *puStack_38;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_78 = this;
  if (*(long *)&(context->astCtx).lookupIndex == 0) {
    puVar7 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar7;
  }
  else {
    local_98 = (context->astCtx).scope.ptr;
    local_a0 = __return_storage_ptr__;
    do {
      ppSVar1 = &local_98->thisSym;
      this_00 = local_98->compilation;
      EVar2 = *(ExpressionKind *)&(this_00->super_BumpAllocator).head;
      local_98 = (Scope *)ppSVar1;
      if (EVar2 == StringLiteral) {
        uVar4 = *(ulong *)&(this_00->options).typoCorrectionLimit;
        uVar8 = uVar4 - 2;
        if (uVar4 < 2) {
          uVar8 = uVar4;
        }
        str._M_str = (char *)(*(long *)&(this_00->options).languageVersion + (ulong)(uVar4 >= 2));
        local_c2 = 1;
        local_90.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)&local_c0;
        local_70._0_8_ = local_78;
        local_70._16_8_ = &local_98;
        local_48 = &local_c2;
        local_40 = function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>
                   ::
                   callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
        ;
        puStack_38 = &local_c1;
        onError.callable = (intptr_t)puStack_38;
        onError.callback =
             function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
        ;
        onArg.callable = (intptr_t)&local_70;
        onArg.callback =
             function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
             ::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__1>
        ;
        onText.callable = (intptr_t)&local_90;
        onText.callback =
             function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__0>
        ;
        str._M_len = uVar8;
        local_70._8_8_ =
             local_90.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        local_70._24_8_ = context;
        local_50 = scope;
        bVar5 = SFormat::parse(str,onText,onArg,onError);
        if ((local_c2 & bVar5) == 0) {
          (local_a0->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          __return_storage_ptr__ = local_a0;
          goto LAB_003285cf;
        }
      }
      else if (EVar2 == EmptyArgument) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_c0,' ');
      }
      else {
        Expression::eval((ConstantValue *)&local_70,(Expression *)this_00,(EvalContext *)scope);
        __return_storage_ptr__ = local_a0;
        if ((char)local_50 == '\0') {
          (local_a0->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_70);
          goto LAB_003285cf;
        }
        this_01 = ((not_null<const_slang::ast::Type_*> *)&(this_00->super_BumpAllocator).endPtr)->
                  ptr;
        bVar5 = Type::isIntegral(this_01);
        specifier = 'd';
        if (!bVar5) {
          pTVar6 = this_01->canonical;
          if (pTVar6 == (Type *)0x0) {
            Type::resolveCanonical(this_01);
            pTVar6 = this_01->canonical;
          }
          SVar3 = (pTVar6->super_Symbol).kind;
          specifier = 'f';
          if (SVar3 != FloatingType) {
            specifier = (SVar3 == StringType) * '\x03' + 'p';
          }
        }
        local_90.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        local_90.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        local_90.leftJustify = false;
        local_90.zeroPad = false;
        bVar5 = Expression::isImplicitString((Expression *)this_00);
        SFormat::formatArg(&local_c0,(ConstantValue *)&local_70,this_01,specifier,&local_90,bVar5);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_70);
      }
    } while (local_98 !=
             (Scope *)(&((context->astCtx).scope.ptr)->compilation +
                      *(long *)&(context->astCtx).lookupIndex));
    puVar7 = (undefined8 *)
             ((long)&(local_a0->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(local_a0->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar7;
    __return_storage_ptr__ = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      (local_a0->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = local_c0._M_dataplus._M_p;
      *(ulong *)((long)&(local_a0->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) =
           CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
      goto LAB_0032858a;
    }
  }
  *puVar7 = CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
  puVar7[1] = local_c0.field_2._8_8_;
LAB_0032858a:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
LAB_003285cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> FmtHelpers::formatDisplay(
    const Scope& scope, EvalContext& context, const std::span<const Expression* const>& args) {
    std::string result;
    auto argIt = args.begin();
    while (argIt != args.end()) {
        // Empty arguments always print a space.
        auto arg = *argIt++;
        if (arg->kind == ExpressionKind::EmptyArgument) {
            result.push_back(' ');
            continue;
        }

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            // Strip quotes from the raw string.
            auto& lit = arg->as<StringLiteral>();
            std::string_view fmt = lit.getRawValue();
            if (fmt.length() >= 2)
                fmt = fmt.substr(1, fmt.length() - 2);

            bool ok = true;
            bool parseOk = SFormat::parse(
                fmt, [&](std::string_view text) { result += text; },
                [&](char specifier, size_t, size_t, const SFormat::FormatOptions& options) {
                    if (formatSpecialArg(specifier, scope, result))
                        return;

                    if (argIt != args.end()) {
                        auto currentArg = *argIt++;
                        auto&& value = currentArg->eval(context);
                        if (!value) {
                            ok = false;
                            return;
                        }

                        SFormat::formatArg(result, value, *currentArg->type, specifier, options,
                                           currentArg->isImplicitString());
                    }
                },
                [](DiagCode, size_t, size_t, std::optional<char>) {});

            ok &= parseOk;
            if (!ok)
                return std::nullopt;
        }
        else {
            // Otherwise, print the value with default options.
            auto&& value = arg->eval(context);
            if (!value)
                return std::nullopt;

            SFormat::formatArg(result, value, *arg->type,
                               getDefaultSpecifier(*arg, LiteralBase::Decimal), {},
                               arg->isImplicitString());
        }
    }

    return result;
}